

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::ClearField(Reflection *this,Message *message,FieldDescriptor *field)

{
  ReflectionSchema *pRVar1;
  uint *puVar2;
  long lVar3;
  undefined8 uVar4;
  FieldDescriptor FVar5;
  OneofDescriptor *oneof_descriptor;
  long lVar6;
  string *default_value;
  byte bVar7;
  bool bVar8;
  uint32 uVar9;
  ulong uVar10;
  EnumValueDescriptor *pEVar11;
  undefined8 *puVar12;
  long lVar13;
  Arena *arena;
  long *plVar14;
  undefined4 uVar15;
  long lVar16;
  FieldDescriptor *local_40;
  _func_void_FieldDescriptor_ptr *local_38;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ClearField","Field does not match message type.");
  }
  if (field[0x42] == (FieldDescriptor)0x1) {
    internal::ExtensionSet::ClearExtension
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite +
               (ulong)(uint)(this->schema_).extensions_offset_),*(int *)(field + 0x44));
    return;
  }
  if (*(int *)(field + 0x3c) == 3) {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_38 = FieldDescriptor::TypeOnceInit;
      local_40 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),&local_38,&local_40);
    }
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4))
    {
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      *(undefined4 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar9) = 0;
      return;
    case 9:
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar10 = (ulong)uVar9;
      lVar13 = (long)*(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + uVar10);
      if (lVar13 < 1) {
        return;
      }
      lVar6 = *(long *)((long)&message[2].super_MessageLite._vptr_MessageLite + uVar10);
      lVar16 = 0;
      do {
        puVar12 = *(undefined8 **)(lVar6 + 8 + lVar16 * 8);
        lVar16 = lVar16 + 1;
        puVar12[1] = 0;
        *(undefined1 *)*puVar12 = 0;
      } while (lVar13 != lVar16);
      *(undefined4 *)((long)&message[1].super_MessageLite._vptr_MessageLite + uVar10) = 0;
      return;
    case 10:
      goto switchD_00290c13_caseD_a;
    default:
      return;
    }
  }
  oneof_descriptor = *(OneofDescriptor **)(field + 0x58);
  if (oneof_descriptor != (OneofDescriptor *)0x0) {
    if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                           *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30)) >>
                                   4) * -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field + 0x44)) {
      return;
    }
    ClearOneof(this,message,oneof_descriptor);
    return;
  }
  bVar8 = HasBit(this,message,field);
  if (!bVar8) {
    return;
  }
  if ((this->schema_).has_bits_offset_ != -1) {
    uVar9 = internal::ReflectionSchema::HasBitIndex(&this->schema_,field);
    bVar7 = (byte)uVar9 & 0x1f;
    puVar2 = (uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                     (ulong)(uVar9 >> 5) * 4 + (ulong)(uint)(this->schema_).has_bits_offset_);
    *puVar2 = *puVar2 & (-2 << bVar7 | 0xfffffffeU >> 0x20 - bVar7);
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_38 = FieldDescriptor::TypeOnceInit;
    local_40 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),&local_38,&local_40);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4)) {
  case 1:
  case 3:
    uVar15 = *(undefined4 *)(field + 0x90);
    goto LAB_00290e4a;
  case 2:
  case 4:
    uVar4 = *(undefined8 *)(field + 0x90);
    uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(undefined8 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar9) = uVar4;
    break;
  case 5:
    uVar4 = *(undefined8 *)(field + 0x90);
    uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(undefined8 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar9) = uVar4;
    break;
  case 6:
    uVar15 = *(undefined4 *)(field + 0x90);
    uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(undefined4 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar9) = uVar15;
    break;
  case 7:
    FVar5 = field[0x90];
    uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(FieldDescriptor *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar9) =
         FVar5;
    break;
  case 8:
    pEVar11 = FieldDescriptor::default_value_enum(field);
    uVar15 = *(undefined4 *)(pEVar11 + 0x10);
LAB_00290e4a:
    uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(undefined4 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar9) = uVar15;
    break;
  case 9:
    pRVar1 = &this->schema_;
    bVar8 = internal::ReflectionSchema::IsFieldInlined(pRVar1,field);
    if (bVar8) {
      internal::ReflectionSchema::GetFieldDefault(pRVar1,field);
      uVar9 = internal::ReflectionSchema::GetFieldOffset(pRVar1,field);
      std::__cxx11::string::_M_assign
                ((string *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar9));
    }
    else {
      puVar12 = (undefined8 *)internal::ReflectionSchema::GetFieldDefault(pRVar1,field);
      default_value = (string *)*puVar12;
      uVar9 = internal::ReflectionSchema::GetFieldOffset(pRVar1,field);
      arena = *(Arena **)
               ((long)&(message->super_MessageLite)._vptr_MessageLite +
               (ulong)(uint)(this->schema_).metadata_offset_);
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
      }
      internal::ArenaStringPtr::SetAllocated
                ((ArenaStringPtr *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar9),
                 default_value,(string *)0x0,arena);
    }
    break;
  case 10:
    pRVar1 = &this->schema_;
    if ((this->schema_).has_bits_offset_ == -1) {
      uVar10 = *(ulong *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                         (ulong)(uint)(this->schema_).metadata_offset_);
      if ((uVar10 & 1) != 0) {
        uVar10 = *(ulong *)((uVar10 & 0xfffffffffffffffe) + 0x18);
      }
      if (uVar10 == 0) {
        uVar9 = internal::ReflectionSchema::GetFieldOffset(pRVar1,field);
        plVar14 = *(long **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar9);
        if (plVar14 != (long *)0x0) {
          (**(code **)(*plVar14 + 8))();
        }
      }
      uVar9 = internal::ReflectionSchema::GetFieldOffset(pRVar1,field);
      *(undefined8 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar9) = 0;
    }
    else {
      uVar9 = internal::ReflectionSchema::GetFieldOffset(pRVar1,field);
      (**(code **)(**(long **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar9)
                  + 0x38))();
    }
  }
  return;
switchD_00290c13_caseD_a:
  bVar8 = anon_unknown_0::IsMapFieldInApi(field);
  uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
  plVar14 = (long *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar9);
  if (bVar8) {
    (**(code **)(*plVar14 + 0x58))(plVar14);
    return;
  }
  lVar13 = plVar14[1];
  if ((long)(int)lVar13 < 1) {
    return;
  }
  lVar6 = plVar14[2];
  lVar16 = 0;
  do {
    lVar3 = lVar16 * 8;
    lVar16 = lVar16 + 1;
    (**(code **)(**(long **)(lVar6 + 8 + lVar3) + 0x38))();
  } while ((int)lVar13 != lVar16);
  *(undefined4 *)(plVar14 + 1) = 0;
  return;
}

Assistant:

void Reflection::ClearField(Message* message,
                            const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE_TYPE(ClearField);

  if (field->is_extension()) {
    MutableExtensionSet(message)->ClearExtension(field->number());
  } else if (!field->is_repeated()) {
    if (field->containing_oneof()) {
      ClearOneofField(message, field);
      return;
    }
    if (HasBit(*message, field)) {
      ClearBit(message, field);

      // We need to set the field back to its default value.
      switch (field->cpp_type()) {
#define CLEAR_TYPE(CPPTYPE, TYPE)                                      \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                             \
    *MutableRaw<TYPE>(message, field) = field->default_value_##TYPE(); \
    break;

        CLEAR_TYPE(INT32, int32);
        CLEAR_TYPE(INT64, int64);
        CLEAR_TYPE(UINT32, uint32);
        CLEAR_TYPE(UINT64, uint64);
        CLEAR_TYPE(FLOAT, float);
        CLEAR_TYPE(DOUBLE, double);
        CLEAR_TYPE(BOOL, bool);
#undef CLEAR_TYPE

        case FieldDescriptor::CPPTYPE_ENUM:
          *MutableRaw<int>(message, field) =
              field->default_value_enum()->number();
          break;

        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING: {
              if (IsInlined(field)) {
                const std::string* default_ptr =
                    &DefaultRaw<InlinedStringField>(field).GetNoArena();
                MutableRaw<InlinedStringField>(message, field)
                    ->SetNoArena(default_ptr, *default_ptr);
                break;
              }

              const std::string* default_ptr =
                  &DefaultRaw<ArenaStringPtr>(field).Get();
              MutableRaw<ArenaStringPtr>(message, field)
                  ->SetAllocated(default_ptr, nullptr, GetArena(message));
              break;
            }
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (!schema_.HasHasbits()) {
            // Proto3 does not have has-bits and we need to set a message field
            // to nullptr in order to indicate its un-presence.
            if (GetArena(message) == nullptr) {
              delete *MutableRaw<Message*>(message, field);
            }
            *MutableRaw<Message*>(message, field) = nullptr;
          } else {
            (*MutableRaw<Message*>(message, field))->Clear();
          }
          break;
      }
    }
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                           \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:                        \
    MutableRaw<RepeatedField<LOWERCASE> >(message, field)->Clear(); \
    break

      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING: {
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING:
            MutableRaw<RepeatedPtrField<std::string> >(message, field)->Clear();
            break;
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        if (IsMapFieldInApi(field)) {
          MutableRaw<MapFieldBase>(message, field)->Clear();
        } else {
          // We don't know which subclass of RepeatedPtrFieldBase the type is,
          // so we use RepeatedPtrFieldBase directly.
          MutableRaw<RepeatedPtrFieldBase>(message, field)
              ->Clear<GenericTypeHandler<Message> >();
        }
        break;
      }
    }
  }
}